

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O1

Own<capnp::compiler::BrandScope,_std::nullptr_t> __thiscall
capnp::compiler::BrandScope::push(BrandScope *this,uint64_t typeId,uint paramCount)

{
  Refcounted *refcounted_1;
  _func_int **pp_Var1;
  undefined4 in_ECX;
  undefined4 in_register_00000014;
  BrandScope *extraout_RDX;
  Refcounted *refcounted;
  Own<capnp::compiler::BrandScope,_std::nullptr_t> OVar2;
  
  *(int *)(typeId + 8) = *(int *)(typeId + 8) + 1;
  pp_Var1 = (_func_int **)operator_new(0x50);
  *(undefined4 *)(pp_Var1 + 1) = 0;
  *pp_Var1 = (_func_int *)&PTR_disposeImpl_0028c080;
  pp_Var1[2] = *(_func_int **)(typeId + 0x10);
  pp_Var1[3] = (_func_int *)typeId;
  pp_Var1[4] = (_func_int *)typeId;
  pp_Var1[5] = (_func_int *)CONCAT44(in_register_00000014,paramCount);
  *(undefined4 *)(pp_Var1 + 6) = in_ECX;
  *(undefined1 *)((long)pp_Var1 + 0x34) = 0;
  pp_Var1[7] = (_func_int *)0x0;
  pp_Var1[8] = (_func_int *)0x0;
  pp_Var1[9] = (_func_int *)0x0;
  *(undefined4 *)(pp_Var1 + 1) = 1;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = pp_Var1;
  *(_func_int ***)&(this->super_Refcounted).refcount = pp_Var1;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

kj::Own<BrandScope> BrandScope::push(uint64_t typeId, uint paramCount) {
  return kj::refcounted<BrandScope>(kj::addRef(*this), typeId, paramCount);
}